

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_complib.c
# Opt level: O0

int load_and_compile_file(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  int rc;
  char *s;
  char errmsg [1024];
  char *options;
  char *fname;
  lua_State *L_local;
  
  pcVar2 = luaL_checklstring(L,1,(size_t *)0x0);
  errmsg._1016_8_ = (long)"\x01" + 1;
  iVar1 = lua_isstring(L,2);
  if (iVar1 != 0) {
    errmsg._1016_8_ = luaL_checklstring(L,2,(size_t *)0x0);
  }
  s._0_1_ = 0;
  pcVar2 = read_file(pcVar2,(char *)&s,0x400);
  if (pcVar2 == (char *)0x0) {
    luaL_error(L,(char *)&s);
    L_local._4_4_ = 0;
  }
  else {
    L_local._4_4_ = load_and_compile_internal(L,pcVar2,(char *)errmsg._1016_8_);
    free(pcVar2);
    if (L_local._4_4_ == 0) {
      luaL_error(L,"Failed to compile");
    }
  }
  return L_local._4_4_;
}

Assistant:

static int load_and_compile_file(lua_State* L) {
  const char* fname = luaL_checkstring(L, 1);
  const char* options = "";
  if (lua_isstring(L, 2)) {
    options = luaL_checkstring(L, 2);
  }
  char errmsg[1024];
  errmsg[0] = 0;
  const char* s = read_file(fname, errmsg, sizeof errmsg);
  if (s == NULL) {
    luaL_error(L, errmsg);
    return 0;
  }
  // FIXME we should use pcall here
  int rc = load_and_compile_internal(L, s, options);
  free((void*)s);
  if (rc == 0) {
    luaL_error(L, "Failed to compile");
  }
  return rc;
}